

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera_source.c
# Opt level: O0

MPP_RET camera_source_deinit(CamSource *ctx)

{
  undefined1 local_d0 [88];
  uint local_78;
  v4l2_buf_type local_74;
  RK_U32 i;
  v4l2_buf_type type;
  v4l2_buffer buf;
  CamSource *ctx_local;
  
  if ((ctx != (CamSource *)0x0) && (-1 < ctx->fd)) {
    local_74 = ctx->type;
    buf._80_8_ = ctx;
    camera_source_ioctl(ctx->fd,0x40045613,&local_74);
    for (local_78 = 0; local_78 < *(uint *)(buf._80_8_ + 4); local_78 = local_78 + 1) {
      memset(local_d0,0,0x58);
      memcpy(&i,local_d0,0x58);
      type = local_74;
      buf.timecode.userbits[0] = '\x01';
      buf.timecode.userbits[1] = '\0';
      buf.timecode.userbits[2] = '\0';
      buf.timecode.userbits[3] = '\0';
      i = local_78;
      camera_source_ioctl(*(RK_S32 *)buf._80_8_,-0x3fa7a9f7,&i);
      if (*(long *)(buf._80_8_ + (ulong)i * 0x20 + 0x28) != 0) {
        mpp_buffer_put_with_caller
                  (*(undefined8 *)(buf._80_8_ + (ulong)i * 0x20 + 0x28),"camera_source_deinit");
      }
      munmap(*(void **)(buf._80_8_ + 0x10 + (ulong)i * 0x20),
             *(size_t *)(buf._80_8_ + (ulong)i * 0x20 + 0x18));
      close(*(int *)(buf._80_8_ + (ulong)local_78 * 0x20 + 0x20));
    }
    close(*(int *)buf._80_8_);
    if (buf._80_8_ != 0) {
      mpp_osal_free("camera_source_deinit",buf._80_8_);
    }
  }
  return MPP_OK;
}

Assistant:

MPP_RET camera_source_deinit(CamSource *ctx)
{
    struct v4l2_buffer buf;
    enum v4l2_buf_type type;
    RK_U32 i;

    if (NULL == ctx)
        return MPP_OK;

    if (ctx->fd < 0)
        return MPP_OK;

    // Stop capturing
    type = ctx->type;

    camera_source_ioctl(ctx->fd, VIDIOC_STREAMOFF, &type);

    // un-mmap() buffers
    for (i = 0 ; i < ctx->bufcnt; i++) {
        buf = (struct v4l2_buffer) {0};
        buf.type    = type;
        buf.memory  = V4L2_MEMORY_MMAP;
        buf.index   = i;
        camera_source_ioctl(ctx->fd, VIDIOC_QUERYBUF, &buf);
        if (ctx->fbuf[buf.index].buffer) {
            mpp_buffer_put(ctx->fbuf[buf.index].buffer);
        }
        munmap(ctx->fbuf[buf.index].start, ctx->fbuf[buf.index].length);
        close(ctx->fbuf[i].export_fd);
    }

    // Close v4l2 device
    close(ctx->fd);
    MPP_FREE(ctx);
    return MPP_OK;
}